

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::TiledFace::getTile(TiledFace *this,int tile)

{
  reference ppFVar1;
  int in_ESI;
  long in_RDI;
  TiledFace *unaff_retaddr;
  FaceData **f;
  undefined4 in_stack_fffffffffffffff0;
  
  ppFVar1 = std::
            vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ::operator[]((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                          *)(in_RDI + 0x38),(long)in_ESI);
  if (*ppFVar1 == (value_type)0x0) {
    readTile(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
             (FaceData **)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return &(*ppFVar1)->super_PtexFaceData;
}

Assistant:

virtual PtexFaceData* getTile(int tile)
        {
            FaceData*& f = _tiles[tile];
            if (!f) readTile(tile, f);
            return f;
        }